

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O3

int hostcache_timestamp_remove(void *datap,void *hc)

{
  if (*(long *)((long)hc + 8) != 0) {
    return (int)(*datap <= *(long *)((long)datap + 8) - *(long *)((long)hc + 8));
  }
  return 0;
}

Assistant:

static int
hostcache_timestamp_remove(void *datap, void *hc)
{
  struct hostcache_prune_data *data =
    (struct hostcache_prune_data *) datap;
  struct Curl_dns_entry *c = (struct Curl_dns_entry *) hc;

  return (0 != c->timestamp)
    && (data->now - c->timestamp >= data->cache_timeout);
}